

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_and_time.c
# Opt level: O1

LY_ERR lyplg_type_compare_date_and_time(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  char *__s1;
  char *__s2;
  int iVar1;
  LY_ERR LVar2;
  
  LVar2 = LY_ENOT;
  if (((val1->field_2).dec64 == (val2->field_2).dec64) &&
     ((val1->field_2).fixed_mem[0x10] == (val2->field_2).fixed_mem[0x10])) {
    __s1 = *(char **)((long)&val1->field_2 + 8);
    if (__s1 == (char *)0x0) {
      if (*(long *)((long)&val2->field_2 + 8) != 0) {
        return LY_ENOT;
      }
    }
    else {
      __s2 = *(char **)((long)&val2->field_2 + 8);
      if (__s2 == (char *)0x0) {
        return LY_ENOT;
      }
      iVar1 = strcmp(__s1,__s2);
      if (iVar1 != 0) {
        return LY_ENOT;
      }
    }
    LVar2 = LY_SUCCESS;
  }
  return LVar2;
}

Assistant:

static LY_ERR
lyplg_type_compare_date_and_time(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1,
        const struct lyd_value *val2)
{
    struct lyd_value_date_and_time *v1, *v2;

    LYD_VALUE_GET(val1, v1);
    LYD_VALUE_GET(val2, v2);

    /* compare timestamp and unknown tz */
    if ((v1->time != v2->time) || (v1->unknown_tz != v2->unknown_tz)) {
        return LY_ENOT;
    }

    /* compare second fractions */
    if ((!v1->fractions_s && !v2->fractions_s) ||
            (v1->fractions_s && v2->fractions_s && !strcmp(v1->fractions_s, v2->fractions_s))) {
        return LY_SUCCESS;
    }
    return LY_ENOT;
}